

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassemblelist.cpp
# Opt level: O2

TPZAutoPointer<TPZDohrAssembleItem<long_double>_> __thiscall
TPZDohrAssembleList<long_double>::PopItem(TPZDohrAssembleList<long_double> *this)

{
  int *in_RSI;
  
  TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)this);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x1a))->__data);
  if (*(list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
        **)(in_RSI + 0x2e) !=
      (list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
       *)(in_RSI + 0x2e)) {
    *in_RSI = *in_RSI + -1;
    TPZAutoPointer<TPZDohrAssembleItem<long_double>_>::operator=
              ((TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)this,
               (TPZAutoPointer<TPZDohrAssembleItem<long_double>_> *)
               &((*(list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                    **)(in_RSI + 0x2e))->
                super__List_base<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                )._M_impl._M_node._M_size);
    std::__cxx11::
    list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
    ::pop_front((list<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrAssembleItem<long_double>_>_>_>
                 *)(in_RSI + 0x2e));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x1a));
  return (TPZAutoPointer<TPZDohrAssembleItem<long_double>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZDohrAssembleItem<TVar> > TPZDohrAssembleList<TVar>::PopItem()
{
	TPZAutoPointer<TPZDohrAssembleItem<TVar> > result;
    std::lock_guard<std::mutex> lock(fListAccessLock);
	if (fWork.begin() != fWork.end()) {
		fNumItems--;
		result = *fWork.begin();
		fWork.pop_front();
	}
	return result;
}